

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HarrisCorner.cpp
# Opt level: O0

void harrisCorner(Mat *img,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners,
                 int threshold,bool isANMS)

{
  float fVar1;
  bool bVar2;
  _InputArray *p_Var3;
  reference pKVar4;
  float *pfVar5;
  int in_R8D;
  Point local_e34;
  undefined1 local_e2c [8];
  KeyPoint point;
  iterator __end2;
  iterator __begin2;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *__range2;
  MatExpr local_df0 [352];
  MatExpr local_c90 [8];
  Mat localMax;
  undefined1 local_c30 [8];
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> cornersANMS;
  _InputArray local_c00;
  Mat local_be8 [352];
  Mat local_a88 [352];
  Mat local_928 [8];
  Mat cNorm;
  Mat local_8c8 [8];
  Mat c;
  Mat local_868 [352];
  _OutputArray local_708;
  _InputArray local_6f0;
  _OutputArray local_6d8;
  _InputArray local_6c0;
  _InputArray local_6a8;
  Mat local_690 [8];
  Mat det2;
  Mat local_630 [8];
  Mat det1;
  Mat local_5d0 [8];
  Mat det;
  Size_<int> local_570;
  _OutputArray local_568;
  _InputArray local_550;
  Size_<int> local_538;
  _OutputArray local_530;
  _InputArray local_518;
  Size_<int> local_500;
  _OutputArray local_4f8;
  _InputArray local_4e0;
  Mat local_4c8 [8];
  Mat GIxIy;
  Mat local_468 [8];
  Mat GIy2;
  Mat local_408 [8];
  Mat GIx2;
  _OutputArray local_3a8;
  _InputArray local_390;
  _InputArray local_378;
  _OutputArray local_360;
  _InputArray local_348;
  _OutputArray local_330;
  _InputArray local_318;
  Mat local_300 [8];
  Mat IxIy;
  Mat local_2a0 [8];
  Mat Iy2;
  Mat local_240 [8];
  Mat Ix2;
  _OutputArray local_1e0;
  _InputArray local_1c8;
  _OutputArray local_1b0;
  _InputArray local_198;
  Mat local_180 [8];
  Mat Iy;
  Mat local_120 [8];
  Mat Ix;
  _InputArray local_c0;
  _InputArray local_98;
  Mat local_80 [8];
  Mat greyImg;
  bool isANMS_local;
  int threshold_local;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners_local;
  Mat *img_local;
  
  cv::Mat::Mat(local_80);
  cv::_InputArray::_InputArray(&local_98,img);
  cv::_OutputArray::_OutputArray((_OutputArray *)&local_c0,local_80);
  cv::cvtColor((cv *)&local_98,&local_c0,(_OutputArray *)0x6,0,in_R8D);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&local_c0);
  cv::_InputArray::~_InputArray(&local_98);
  cv::Mat::Mat(local_120);
  cv::Mat::Mat(local_180);
  cv::_InputArray::_InputArray(&local_198,local_80);
  cv::_OutputArray::_OutputArray(&local_1b0,local_120);
  cv::Scharr(&local_198,&local_1b0,5,1,0,1.0,0.0,4);
  cv::_OutputArray::~_OutputArray(&local_1b0);
  cv::_InputArray::~_InputArray(&local_198);
  cv::_InputArray::_InputArray(&local_1c8,local_80);
  cv::_OutputArray::_OutputArray(&local_1e0,local_180);
  cv::Scharr(&local_1c8,&local_1e0,5,0,1,1.0,0.0,4);
  cv::_OutputArray::~_OutputArray(&local_1e0);
  cv::_InputArray::~_InputArray(&local_1c8);
  cv::Mat::Mat(local_240);
  cv::Mat::Mat(local_2a0);
  cv::Mat::Mat(local_300);
  cv::_InputArray::_InputArray(&local_318,local_120);
  cv::_OutputArray::_OutputArray(&local_330,local_240);
  cv::pow(&local_318,2.0,&local_330);
  cv::_OutputArray::~_OutputArray(&local_330);
  cv::_InputArray::~_InputArray(&local_318);
  cv::_InputArray::_InputArray(&local_348,local_180);
  cv::_OutputArray::_OutputArray(&local_360,local_2a0);
  cv::pow(&local_348,2.0,&local_360);
  cv::_OutputArray::~_OutputArray(&local_360);
  cv::_InputArray::~_InputArray(&local_348);
  cv::_InputArray::_InputArray(&local_378,local_120);
  cv::_InputArray::_InputArray(&local_390,local_180);
  cv::_OutputArray::_OutputArray(&local_3a8,local_300);
  cv::multiply(&local_378,&local_390,&local_3a8,1.0,-1);
  cv::_OutputArray::~_OutputArray(&local_3a8);
  cv::_InputArray::~_InputArray(&local_390);
  cv::_InputArray::~_InputArray(&local_378);
  cv::Mat::Mat(local_408);
  cv::Mat::Mat(local_468);
  cv::Mat::Mat(local_4c8);
  cv::_InputArray::_InputArray(&local_4e0,local_240);
  cv::_OutputArray::_OutputArray(&local_4f8,local_408);
  cv::Size_<int>::Size_(&local_500,9,9);
  cv::GaussianBlur(0x3ff0000000000000,0,&local_4e0,&local_4f8,&local_500,4);
  cv::_OutputArray::~_OutputArray(&local_4f8);
  cv::_InputArray::~_InputArray(&local_4e0);
  cv::_InputArray::_InputArray(&local_518,local_2a0);
  cv::_OutputArray::_OutputArray(&local_530,local_468);
  cv::Size_<int>::Size_(&local_538,9,9);
  cv::GaussianBlur(0x3ff0000000000000,0,&local_518,&local_530,&local_538,4);
  cv::_OutputArray::~_OutputArray(&local_530);
  cv::_InputArray::~_InputArray(&local_518);
  cv::_InputArray::_InputArray(&local_550,local_300);
  cv::_OutputArray::_OutputArray(&local_568,local_4c8);
  cv::Size_<int>::Size_(&local_570,9,9);
  cv::GaussianBlur(0x3ff0000000000000,0,&local_550,&local_568,&local_570,4);
  cv::_OutputArray::~_OutputArray(&local_568);
  cv::_InputArray::~_InputArray(&local_550);
  cv::Mat::Mat(local_5d0);
  cv::Mat::Mat(local_630);
  cv::Mat::Mat(local_690);
  cv::_InputArray::_InputArray(&local_6a8,local_408);
  cv::_InputArray::_InputArray(&local_6c0,local_468);
  cv::_OutputArray::_OutputArray(&local_6d8,local_630);
  cv::multiply(&local_6a8,&local_6c0,&local_6d8,1.0,-1);
  cv::_OutputArray::~_OutputArray(&local_6d8);
  cv::_InputArray::~_InputArray(&local_6c0);
  cv::_InputArray::~_InputArray(&local_6a8);
  cv::_InputArray::_InputArray(&local_6f0,local_4c8);
  cv::_OutputArray::_OutputArray(&local_708,local_690);
  cv::pow(&local_6f0,2.0,&local_708);
  cv::_OutputArray::~_OutputArray(&local_708);
  cv::_InputArray::~_InputArray(&local_6f0);
  cv::operator-(local_868,local_630);
  cv::Mat::operator=(local_5d0,(MatExpr *)local_868);
  cv::MatExpr::~MatExpr((MatExpr *)local_868);
  cv::Mat::Mat(local_8c8);
  cv::Mat::Mat(local_928);
  cv::operator+(local_be8,local_408);
  cv::operator/(local_a88,(MatExpr *)local_5d0);
  cv::Mat::operator=(local_8c8,(MatExpr *)local_a88);
  cv::MatExpr::~MatExpr((MatExpr *)local_a88);
  cv::MatExpr::~MatExpr((MatExpr *)local_be8);
  cv::_InputArray::_InputArray(&local_c00,local_8c8);
  cv::_InputOutputArray::_InputOutputArray
            ((_InputOutputArray *)
             &cornersANMS.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_928);
  p_Var3 = (_InputArray *)cv::noArray();
  cv::normalize(&local_c00,
                (_InputOutputArray *)
                &cornersANMS.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage,0.0,255.0,0x20,5,p_Var3);
  cv::_InputOutputArray::~_InputOutputArray
            ((_InputOutputArray *)
             &cornersANMS.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cv::_InputArray::~_InputArray(&local_c00);
  if (isANMS) {
    std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::vector
              ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_c30);
    ANMS(local_928,(vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_c30,threshold);
    cv::MatSize::operator()((MatSize *)&__range2);
    cv::Mat::zeros(local_df0,&__range2,5);
    cv::MatExpr::operator_cast_to_Mat(local_c90);
    cv::MatExpr::~MatExpr(local_df0);
    __end2 = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::begin
                       ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_c30);
    point._20_8_ = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::end
                             ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_c30);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                                  *)&point.octave);
      if (!bVar2) break;
      pKVar4 = __gnu_cxx::
               __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
               ::operator*(&__end2);
      cv::KeyPoint::KeyPoint((KeyPoint *)local_e2c,pKVar4);
      fVar1 = point.size;
      cv::Point_::operator_cast_to_Point_((Point_ *)&local_e34);
      pfVar5 = cv::Mat::at<float>((Mat *)local_c90,&local_e34);
      *pfVar5 = fVar1;
      __gnu_cxx::
      __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>::
      operator++(&__end2);
    }
    localMaxima((Mat *)local_c90,corners,0);
    cv::Mat::~Mat((Mat *)local_c90);
    std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~vector
              ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_c30);
  }
  else {
    localMaxima(local_928,corners,threshold);
  }
  cv::Mat::~Mat(local_928);
  cv::Mat::~Mat(local_8c8);
  cv::Mat::~Mat(local_690);
  cv::Mat::~Mat(local_630);
  cv::Mat::~Mat(local_5d0);
  cv::Mat::~Mat(local_4c8);
  cv::Mat::~Mat(local_468);
  cv::Mat::~Mat(local_408);
  cv::Mat::~Mat(local_300);
  cv::Mat::~Mat(local_2a0);
  cv::Mat::~Mat(local_240);
  cv::Mat::~Mat(local_180);
  cv::Mat::~Mat(local_120);
  cv::Mat::~Mat(local_80);
  return;
}

Assistant:

void harrisCorner(const Mat& img, vector<KeyPoint>& corners, int threshold, bool isANMS) {
	Mat greyImg;
	cvtColor(img, greyImg, COLOR_BGR2GRAY);
	//GaussianBlur(greyImg, greyImg, Size(3, 3),1);
	Mat Ix, Iy;
	Scharr(greyImg, Ix, CV_32F, 1, 0);
	Scharr(greyImg, Iy, CV_32F, 0, 1);
	Mat Ix2, Iy2, IxIy;
	pow(Ix,2.0,Ix2);
	pow(Iy, 2.0, Iy2);
	multiply(Ix, Iy, IxIy);

	Mat GIx2, GIy2, GIxIy;
	GaussianBlur(Ix2, GIx2, Size(9, 9), 1);
	GaussianBlur(Iy2, GIy2, Size(9, 9), 1);
	GaussianBlur(IxIy, GIxIy, Size(9, 9), 1);

	Mat det, det1, det2;
	multiply(GIx2, GIy2, det1);
	pow(GIxIy, 2.0, det2);
	det = det1 - det2;

	Mat c, cNorm;
	c = det/(GIx2+GIy2);

	normalize(c, cNorm, 0, 255, NORM_MINMAX, CV_32F);
	
	if (isANMS) {
		std::vector<KeyPoint> cornersANMS;
		ANMS(cNorm, cornersANMS, threshold);

		Mat localMax = Mat::zeros(cNorm.size(), CV_32F);
		for (KeyPoint point : cornersANMS) {
			localMax.at<float>(point.pt) = point.response;
		}
		localMaxima(localMax, corners, 0);
	}
	else {
		localMaxima(cNorm, corners, threshold);
	}

}